

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Genome::AddRnaseSite(Genome *this,int start,int stop)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  __l;
  FixedElement *pFVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_c8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  shared_ptr<BindingSite> rnase_site;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_80;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  binding;
  int stop_local;
  int start_local;
  Genome *this_local;
  
  binding._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = stop;
  binding._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = start;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::pair<const_char_(&)[8],_double_&,_true>
            (&local_80,(char (*) [8])"__rnase",&this->transcript_degradation_rate_);
  local_58 = &local_80;
  local_50 = 1;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             *)((long)&rnase_site.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::allocator(this_00);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
         *)local_48,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&rnase_site.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 3),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                *)((long)&rnase_site.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 2));
  local_c8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)&local_58;
  do {
    local_c8 = local_c8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~pair(local_c8);
  } while (local_c8 != &local_80);
  std::
  make_shared<BindingSite,char_const(&)[13],int&,int&,std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&>
            ((char (*) [13])local_a8,(int *)"__rnase_site",
             (int *)((long)&binding._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&binding._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pFVar1 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_a8)->super_FixedElement;
  local_ac = FixedElement::start(pFVar1);
  pFVar1 = &std::__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<BindingSite,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )local_a8)->super_FixedElement;
  local_b0 = FixedElement::stop(pFVar1);
  std::
  vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
  ::emplace_back<int,int,std::shared_ptr<BindingSite>&>
            ((vector<Interval<std::shared_ptr<BindingSite>,unsigned_long>,std::allocator<Interval<std::shared_ptr<BindingSite>,unsigned_long>>>
              *)&this->transcript_rbs_intervals_,&local_ac,&local_b0,
             (shared_ptr<BindingSite> *)local_a8);
  std::shared_ptr<BindingSite>::~shared_ptr((shared_ptr<BindingSite> *)local_a8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *)local_48);
  return;
}

Assistant:

void Genome::AddRnaseSite(int start, int stop) {
  auto binding =
      std::map<std::string, double>{{"__rnase", transcript_degradation_rate_}};
  auto rnase_site =
      std::make_shared<BindingSite>("__rnase_site", start, stop, binding);
  transcript_rbs_intervals_.emplace_back(rnase_site->start(),
                                         rnase_site->stop(), rnase_site);
}